

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthImage.cpp
# Opt level: O0

DepthImage * __thiscall DepthImage::operator+=(DepthImage *this,DepthImage *oth)

{
  int iVar1;
  int iVar2;
  Rgba *pRVar3;
  Rgba *this_00;
  Rgba *pRVar4;
  Rgba *this_01;
  float fVar5;
  float fVar6;
  Rgba *d_oth;
  Rgba *c_oth;
  Rgba *d_me;
  Rgba *c_me;
  int x;
  int y;
  int h;
  int w;
  DepthImage *oth_local;
  DepthImage *this_local;
  
  iVar1 = Image::Width(&this->color);
  iVar2 = Image::Height(&this->color);
  for (c_me._4_4_ = 0; c_me._4_4_ < iVar2; c_me._4_4_ = c_me._4_4_ + 1) {
    for (c_me._0_4_ = 0; (int)c_me < iVar1; c_me._0_4_ = (int)c_me + 1) {
      pRVar3 = Image::PixelAt(&this->color,(int)c_me,c_me._4_4_);
      this_00 = Image::PixelAt(&this->depth,(int)c_me,c_me._4_4_);
      pRVar4 = Image::PixelAt(&oth->color,(int)c_me,c_me._4_4_);
      this_01 = Image::PixelAt(&oth->depth,(int)c_me,c_me._4_4_);
      fVar5 = half::operator_cast_to_float(&this_00->r);
      fVar6 = half::operator_cast_to_float(&this_01->r);
      if (fVar5 < fVar6) {
        *pRVar3 = *pRVar4;
        *this_00 = *this_01;
      }
    }
  }
  return this;
}

Assistant:

DepthImage &DepthImage::operator+=(const DepthImage &oth) {

    auto w = color.Width();
    auto h = color.Height();

    for (int y = 0; y < h; ++y) {
        for (int x = 0; x < w; ++x) {

            // c - color, d - depth

            // My data
            auto &c_me = color.PixelAt(x, y);
            auto &d_me = depth.PixelAt(x, y);

            // Oth data
            const auto &c_oth = oth.color.PixelAt(x, y);
            const auto &d_oth = oth.depth.PixelAt(x, y);

            // Depth test
            if (d_me.r < d_oth.r) {
                c_me = c_oth;
                d_me = d_oth;
            }
        }
    }

    return *this;
}